

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall TPZMatrix<long_double>::VerifySymmetry(TPZMatrix<long_double> *this,REAL tol)

{
  long lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  uint uVar6;
  ostream *poVar7;
  long lVar8;
  bool bVar9;
  long lVar10;
  long lVar11;
  longdouble in_ST0;
  longdouble lVar12;
  longdouble lVar13;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  
  lVar1 = (this->super_TPZBaseMatrix).fRow;
  uVar6 = 0;
  if (lVar1 == (this->super_TPZBaseMatrix).fCol) {
    if (lVar1 < 1) {
      bVar9 = true;
    }
    else {
      lVar8 = 1;
      bVar9 = false;
      lVar10 = 0;
      do {
        lVar11 = 0;
        lVar12 = in_ST0;
        lVar13 = in_ST1;
        lVar2 = in_ST2;
        lVar3 = in_ST3;
        lVar4 = in_ST4;
        lVar5 = in_ST5;
        in_ST5 = in_ST7;
        do {
          in_ST4 = in_ST6;
          in_ST3 = lVar5;
          in_ST2 = lVar4;
          in_ST1 = lVar3;
          in_ST0 = lVar2;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar10,lVar11)
          ;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar11,lVar10)
          ;
          if (tol < (double)ABS(lVar12 - lVar13)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Elemento: ",10);
            poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = std::ostream::_M_insert<long>((long)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  -> ",5);
            poVar7 = std::ostream::_M_insert<long_double>(lVar12 - lVar13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"/",1);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                      (this,lVar10,lVar11);
            poVar7 = std::ostream::_M_insert<long_double>(in_ST0);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            goto LAB_00c454e1;
          }
          lVar11 = lVar11 + 1;
          lVar12 = in_ST0;
          lVar13 = in_ST1;
          lVar2 = in_ST2;
          lVar3 = in_ST3;
          lVar4 = in_ST4;
          lVar5 = in_ST5;
          in_ST6 = in_ST5;
        } while (lVar8 != lVar11);
        lVar10 = lVar10 + 1;
        lVar8 = lVar8 + 1;
        bVar9 = lVar1 <= lVar10;
        in_ST7 = in_ST5;
      } while (lVar10 != lVar1);
    }
LAB_00c454e1:
    uVar6 = (uint)bVar9;
  }
  return uVar6;
}

Assistant:

int TPZMatrix<TVar>::VerifySymmetry(REAL tol) const{
	int64_t nrows = this->Rows();
	int64_t ncols = this->Cols();
	if (nrows != ncols) return 0;
	
	for( int64_t i = 0; i < nrows; i++){
		for(int64_t j = 0; j <= i; j++){
            TVar exp = this->Get(i,j) - this->Get(j,i);
			if ( (REAL)(fabs( exp )) > tol ) {
			  	#ifdef STATE_COMPLEX
				cout << "Elemento: " << i << ", " << j << "  -> " << fabs( exp ) << "/" <<
				this->Get(i,j) << endl;
				#else
				cout << "Elemento: " << i << ", " << j << "  -> " << exp << "/" <<
				this->Get(i,j) << endl;
				#endif
				return 0;
			}
		}
	}
	return 1;
}